

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  ushort *puVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_78;
  char *local_70;
  ulong local_68;
  size_type local_60;
  undefined8 local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  undefined8 local_38;
  char *local_30;
  ulong local_28;
  long local_20;
  undefined8 local_18;
  char *local_10;
  
  puVar1 = *(ushort **)(**(long **)this + 8);
  local_68 = (ulong)puVar1[1];
  local_48 = (ulong)*puVar1;
  local_78 = 8;
  local_70 = "Option \"";
  pieces._M_len = ~local_68 + (long)puVar1;
  local_40 = ~local_48 + (long)puVar1;
  local_58 = 0x3c;
  local_50 = "\" is a message. To set the entire message, use syntax like \"";
  local_38 = 0x47;
  local_30 = " = { <proto text format> }\". To set fields within it, use syntax like \"";
  local_18 = 0xe;
  local_10 = ".foo = value\".";
  pieces._M_array = (iterator)0x7;
  local_60 = pieces._M_len;
  local_28 = local_48;
  local_20 = local_40;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_78,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}